

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

void __thiscall
icu_63::UCharsTrieBuilder::UCharsTrieBuilder(UCharsTrieBuilder *this,UErrorCode *param_1)

{
  StringTrieBuilder::StringTrieBuilder(&this->super_StringTrieBuilder);
  (this->super_StringTrieBuilder).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UCharsTrieBuilder_003aa6d0;
  (this->strings).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->strings).fUnion.fStackFields.fLengthAndFlags = 2;
  this->elements = (UCharsTrieElement *)0x0;
  this->elementsCapacity = 0;
  this->elementsLength = 0;
  this->uchars = (char16_t *)0x0;
  this->ucharsCapacity = 0;
  this->ucharsLength = 0;
  return;
}

Assistant:

UCharsTrieBuilder::UCharsTrieBuilder(UErrorCode & /*errorCode*/)
        : elements(NULL), elementsCapacity(0), elementsLength(0),
          uchars(NULL), ucharsCapacity(0), ucharsLength(0) {}